

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void __thiscall CTxMemPool::RemoveUnbroadcastTx(CTxMemPool *this,uint256 *txid,bool unchecked)

{
  bool bVar1;
  size_type sVar2;
  uint256 *puVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  char *local_58;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock16,&this->cs,"cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txmempool.cpp"
             ,0x40b,false);
  puVar3 = txid;
  sVar2 = std::
          _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
          ::erase(&(this->m_unbroadcast_txids)._M_t,txid);
  if (sVar2 != 0) {
    bVar1 = ::LogAcceptCategory(NET,(Level)puVar3);
    if (bVar1) {
      base_blob<256u>::GetHex_abi_cxx11_(&local_40,(base_blob<256u> *)txid);
      local_58 = "";
      if (unchecked) {
        local_58 = " before confirmation that txn was sent out";
      }
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txmempool.cpp";
      source_file._M_len = 0x56;
      logging_function._M_str = "RemoveUnbroadcastTx";
      logging_function._M_len = 0x13;
      LogPrintf_<std::__cxx11::string,char_const*>
                (logging_function,source_file,0x40f,MEMPOOL,Debug,
                 "Removed %i from set of unbroadcast txns%s\n",&local_40,&local_58);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock16.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTxMemPool::RemoveUnbroadcastTx(const uint256& txid, const bool unchecked) {
    LOCK(cs);

    if (m_unbroadcast_txids.erase(txid))
    {
        LogDebug(BCLog::MEMPOOL, "Removed %i from set of unbroadcast txns%s\n", txid.GetHex(), (unchecked ? " before confirmation that txn was sent out" : ""));
    }
}